

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall blip_eq_t::generate(blip_eq_t *this,float *out,int count)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar3 = (double)this->sample_rate * 0.5;
  if (this->cutoff_freq == 0) {
    dVar11 = 144.0 / (double)count + 0.85;
  }
  else {
    dVar11 = dVar3 / (double)this->cutoff_freq;
  }
  dVar3 = ((double)this->rolloff_freq * dVar11) / dVar3;
  dVar4 = this->treble;
  if (0.999 <= dVar3) {
    dVar3 = 0.999;
  }
  if (dVar4 <= -300.0) {
    dVar4 = -300.0;
  }
  if (5.0 <= dVar4) {
    dVar4 = 5.0;
  }
  dVar4 = exp2((dVar4 * 4.0550880064543e-05) / (1.0 - dVar3));
  dVar5 = pow(dVar4,4096.0 - dVar3 * 4096.0);
  if (0 < count) {
    lVar2 = 0;
    do {
      dVar10 = (double)(count * -2 + 1 + (int)lVar2) * 5.992112452678286e-06 * (1.0 / dVar11);
      dVar12 = dVar10 * 4096.0 * dVar3;
      dVar6 = 4096.0;
      if (dVar12 != 0.0) {
        dVar6 = sin(dVar12);
        dVar6 = (dVar6 * 4096.0) / dVar12;
      }
      dVar7 = cos(dVar10);
      dVar7 = (dVar4 - (dVar7 + dVar7)) * dVar4 + 1.0;
      if (1e-13 < dVar7) {
        dVar8 = cos(dVar10 * 4095.0);
        dVar9 = cos(dVar10 * 4096.0);
        dVar10 = cos(dVar12 - dVar10);
        dVar12 = cos(dVar12);
        dVar6 = dVar6 * dVar3 +
                ((dVar12 + (dVar8 * dVar4 - dVar9) * dVar5) - dVar10 * dVar4) / dVar7;
      }
      *(float *)((long)out + lVar2 * 2) = (float)dVar6;
      lVar2 = lVar2 + 2;
    } while ((ulong)(uint)count * 2 != lVar2);
  }
  if (count != 0) {
    iVar1 = count + -1;
    dVar3 = (double)iVar1;
    lVar2 = (long)count;
    do {
      dVar11 = cos((double)iVar1 * 3.141592653589793 * (1.0 / dVar3));
      iVar1 = iVar1 + -1;
      out[lVar2 + -1] = ((float)dVar11 * -0.46 + 0.54) * out[lVar2 + -1];
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void blip_eq_t::generate( float* out, int count ) const
{
	// lower cutoff freq for narrow kernels with their wider transition band
	// (8 points->1.49, 16 points->1.15)
	double oversample = blip_res * 2.25 / count + 0.85;
	double half_rate = sample_rate * 0.5;
	if ( cutoff_freq )
		oversample = half_rate / cutoff_freq;
	double cutoff = rolloff_freq * oversample / half_rate;
	
	gen_sinc( out, count, blip_res * oversample, treble, cutoff );
	
	// apply (half of) hamming window
	double to_fraction = PI / (count - 1);
	for ( int i = count; i--; )
		out [i] *= 0.54f - 0.46f * (float) cos( i * to_fraction );
}